

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O1

int mod2sparse_decomp_osd(mod2sparse *A,int R,mod2sparse *L,mod2sparse *U,int *rows,int *cols)

{
  uint n;
  uint n_00;
  int iVar1;
  uint row;
  bool bVar2;
  void *__ptr;
  void *__ptr_00;
  mod2sparse *r;
  mod2entry *pmVar3;
  ulong uVar4;
  long lVar5;
  mod2entry *extraout_RAX;
  mod2entry *pmVar6;
  int iVar7;
  uint col;
  uint extraout_EDX;
  ulong uVar8;
  uint row_00;
  undefined4 in_register_00000034;
  mod2sparse *pmVar9;
  uint col_00;
  
  lVar5 = CONCAT44(in_register_00000034,R);
  if (L->n_cols == R) {
    n = A->n_rows;
    pmVar6 = (mod2entry *)(ulong)n;
    if (L->n_rows == n) {
      n_00 = A->n_cols;
      if ((U->n_cols == n_00) && (U->n_rows == R)) {
        if (R <= (int)n_00) {
          __ptr = chk_alloc(n,4);
          __ptr_00 = chk_alloc(n_00,4);
          mod2sparse_clear(L);
          mod2sparse_clear(U);
          r = mod2sparse_allocate(n,n_00);
          mod2sparse_copy(A,r);
          if (0 < (int)n) {
            pmVar3 = (mod2entry *)0x0;
            do {
              *(int *)((long)__ptr + (long)pmVar3 * 4) = (int)pmVar3;
              rows[(long)pmVar3] = (int)pmVar3;
              pmVar3 = (mod2entry *)((long)&pmVar3->row + 1);
            } while (pmVar6 != pmVar3);
          }
          if (0 < (int)n_00) {
            uVar4 = 0;
            do {
              *(int *)((long)__ptr_00 + (long)cols[uVar4] * 4) = (int)uVar4;
              uVar4 = uVar4 + 1;
            } while (n_00 != uVar4);
          }
          if (R < 1) {
            iVar7 = 0;
          }
          else {
            uVar4 = 0;
            iVar7 = 0;
            do {
              bVar2 = (long)(int)n_00 <= (long)uVar4;
              uVar8 = uVar4;
              if ((long)uVar4 < (long)(int)n_00) {
                do {
                  for (pmVar6 = r->cols[cols[uVar8]].down; -1 < pmVar6->row; pmVar6 = pmVar6->down)
                  {
                    if ((long)uVar4 <= (long)*(int *)((long)__ptr + (ulong)(uint)pmVar6->row * 4))
                    goto LAB_00121b2c;
                  }
                  uVar8 = uVar8 + 1;
                  bVar2 = (long)(int)n_00 <= (long)uVar8;
                } while (uVar8 != n_00);
              }
LAB_00121b2c:
              col_00 = (uint)uVar4;
              if (!bVar2) {
                if (*(int *)((long)__ptr_00 + (long)pmVar6->col * 4) != (int)uVar8) {
                  printf("\n e: %i, k: %i");
                  printf("\nError. Exiting.");
                  exit(1);
                }
                cols[uVar8 & 0xffffffff] = cols[uVar4];
                cols[uVar4] = pmVar6->col;
                *(int *)((long)__ptr_00 + (long)cols[uVar8 & 0xffffffff] * 4) = (int)uVar8;
                *(uint *)((long)__ptr_00 + (long)cols[uVar4] * 4) = col_00;
                iVar1 = *(int *)((long)__ptr + (long)pmVar6->row * 4);
                lVar5 = (long)iVar1;
                if (lVar5 < (long)uVar4) {
                  abort();
                }
                rows[lVar5] = rows[uVar4];
                rows[uVar4] = pmVar6->row;
                *(int *)((long)__ptr + (long)rows[lVar5] * 4) = iVar1;
                *(uint *)((long)__ptr + (long)rows[uVar4] * 4) = col_00;
              }
              pmVar3 = r->cols[cols[uVar4]].down;
              while (row = pmVar3->row, -1 < (int)row) {
                pmVar3 = pmVar3->down;
                row_00 = *(uint *)((long)__ptr + (ulong)row * 4);
                if ((long)uVar4 < (long)(int)row_00) {
                  mod2sparse_add_row(r,row,r,pmVar6->row);
                  pmVar9 = L;
                  col = col_00;
                  row_00 = row;
                }
                else {
                  pmVar9 = U;
                  if ((long)(int)row_00 < (long)uVar4) {
                    col = cols[uVar4];
                  }
                  else {
                    mod2sparse_insert(L,row,col_00);
                    col = cols[uVar4];
                    row_00 = col_00;
                  }
                }
                mod2sparse_insert(pmVar9,row_00,col);
              }
              pmVar3 = r->cols;
              while (-1 < (pmVar3[cols[uVar4]].down)->row) {
                mod2sparse_delete(r,pmVar3[cols[uVar4]].down);
                pmVar3 = r->cols;
              }
              iVar7 = iVar7 + (uint)bVar2;
              uVar4 = uVar4 + 1;
            } while (uVar4 != (uint)R);
          }
          if (R < (int)n) {
            lVar5 = (long)R;
            do {
              while (pmVar6 = L->rows[rows[lVar5]].right, -1 < pmVar6->row) {
                mod2sparse_delete(L,pmVar6);
              }
              lVar5 = lVar5 + 1;
            } while (n != (uint)lVar5);
          }
          mod2sparse_free(r);
          free(__ptr);
          free(__ptr_00);
          return iVar7;
        }
        goto LAB_00121d60;
      }
    }
  }
  mod2sparse_decomp_osd_cold_1();
LAB_00121d60:
  mod2sparse_decomp_osd_cold_2();
  if (((U->n_cols <= A->n_cols) || (U->n_rows < (int)extraout_EDX)) || (U->n_rows < A->n_rows)) {
    printf("mod2sparse_merge_vec: the receiving matrix doesn\'t have the good dimensions");
  }
  mod2sparse_copy(A,U);
  iVar7 = (int)extraout_RAX;
  if (0 < (int)extraout_EDX) {
    iVar1 = A->n_cols;
    uVar4 = 0;
    pmVar6 = extraout_RAX;
    do {
      if (*(char *)(lVar5 + uVar4) != '\0') {
        pmVar6 = mod2sparse_insert(U,(int)uVar4,iVar1);
      }
      iVar7 = (int)pmVar6;
      uVar4 = uVar4 + 1;
    } while (extraout_EDX != uVar4);
  }
  return iVar7;
}

Assistant:

int mod2sparse_decomp_osd
        ( mod2sparse *A,	/* Input matrix, M by N */
          int R,		/* Size of sub-matrix to find LU decomposition of */
          mod2sparse *L,	/* Matrix in which L is stored, M by R */
          mod2sparse *U,	/* Matrix in which U is stored, R by N */
          int *rows,		/* Array where row indexes are stored, M long */
          int *cols		/* Array where column indexes are stored, N long */
        )
{

    int abandon_number=0;  	/* Number of columns to abandon at some point *//* When to abandon these columns */
    int abandon_when=0;
    mod2sparse_strategy strategy =Mod2sparse_first;/* Strategy to follow in picking rows/columns */

    int *rinv, *cinv, *acnt, *rcnt;
    mod2sparse *B;
    int M, N;

    mod2entry *e, *f, *fn, *e2;
    int i, j, k, cc, cc2, cc3, cr2, pr;
    int found, nnf;

    M = mod2sparse_rows(A);
    N = mod2sparse_cols(A);

    if (mod2sparse_cols(L)!=R || mod2sparse_rows(L)!=M
        || mod2sparse_cols(U)!=N || mod2sparse_rows(U)!=R)
    { fprintf (stderr,
               "mod2sparse_decomp: Matrices have incompatible dimensions\n");
        exit(1);
    }

    if (abandon_number>N-R)
    { fprintf(stderr,"Trying to abandon more columns than allowed\n");
        exit(1);
    }

    rinv = chk_alloc (M, sizeof *rinv);
    cinv = chk_alloc (N, sizeof *cinv);

    if (abandon_number>0)
    { acnt = chk_alloc (M+1, sizeof *acnt);
    }

    if (strategy==Mod2sparse_minprod)
    { rcnt = chk_alloc (M, sizeof *rcnt);
    }


    //these are the problematic functions!
    mod2sparse_clear(L);
    mod2sparse_clear(U);

    /* Copy A to B.  B will be modified, then discarded. */

    B = mod2sparse_allocate(M,N);
    mod2sparse_copy(A,B);

    /* Count 1s in rows of B, if using minprod strategy. */

    if (strategy==Mod2sparse_minprod)
    { for (i = 0; i<M; i++)
        { rcnt[i] = mod2sparse_count_row(B,i);
        }
    }

    /* Set up initial row and column choices. */

    for (i = 0; i<M; i++) rows[i] = rinv[i] = i;
    for (j = 0; j<N; j++) {

        cinv[cols[j]]=j;

    }
    /* Find L and U one column at a time. */

    nnf = 0;

    for (i = 0; i<R; i++)
    {
        /* Choose the next row and column of B. */

        switch (strategy)
        {
            case Mod2sparse_first:
            {
                found = 0;

                for (k = i; k<N; k++)
                { e = mod2sparse_first_in_col(B,cols[k]);
                    while (!mod2sparse_at_end(e))
                    { if (rinv[mod2sparse_row(e)]>=i)
                        { found = 1;
                            goto out_first;
                        }
                        e = mod2sparse_next_in_col(e);
                    }
                }

                out_first:
                break;
            }

            case Mod2sparse_mincol:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    if (!found || cc2<cc)
                    { e2 = mod2sparse_first_in_col(B,cols[j]);
                        while (!mod2sparse_at_end(e2))
                        { if (rinv[mod2sparse_row(e2)]>=i)
                            { found = 1;
                                cc = cc2;
                                e = e2;
                                k = j;
                                break;
                            }
                            e2 = mod2sparse_next_in_col(e2);
                        }
                    }
                }

                break;
            }

            case Mod2sparse_minprod:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    e2 = mod2sparse_first_in_col(B,cols[j]);
                    while (!mod2sparse_at_end(e2))
                    { if (rinv[mod2sparse_row(e2)]>=i)
                        { cr2 = rcnt[mod2sparse_row(e2)];
                            if (!found || cc2==1 || (cc2-1)*(cr2-1)<pr)
                            { found = 1;
                                pr = cc2==1 ? 0 : (cc2-1)*(cr2-1);
                                e = e2;
                                k = j;
                            }
                        }
                        e2 = mod2sparse_next_in_col(e2);
                    }
                }

                break;
            }

            default:
            { fprintf(stderr,"mod2sparse_decomp: Unknown stategy\n");
                exit(1);
            }
        }

        if (!found)
        { nnf += 1;
        }



        /* Update 'rows' and 'cols'.  Looks at 'k' and 'e' found above. */

        if (found)
        {
            // if (cinv[mod2sparse_col(e)]!=k) abort();
            if (cinv[mod2sparse_col(e)]!=k){
                printf("\n e: %i, k: %i",mod2sparse_col(e),k);
                printf("\nError. Exiting.");
                exit(1);
            }


            cols[k] = cols[i];
            cols[i] = mod2sparse_col(e);

            cinv[cols[k]] = k;
            cinv[cols[i]] = i;

            k = rinv[mod2sparse_row(e)];

            if (k<i) abort();

            rows[k] = rows[i];
            rows[i] = mod2sparse_row(e);

            rinv[rows[k]] = k;
            rinv[rows[i]] = i;
        }



        /* Update L, U, and B. */

        f = mod2sparse_first_in_col(B,cols[i]);

        while (!mod2sparse_at_end(f))
        {
            fn = mod2sparse_next_in_col(f);
            k = mod2sparse_row(f);
            if (rinv[k]>i)
            { mod2sparse_add_row(B,k,B,mod2sparse_row(e));
                if (strategy==Mod2sparse_minprod)
                { rcnt[k] = mod2sparse_count_row(B,k);
                }
                mod2sparse_insert(L,k,i);
            }
            else if (rinv[k]<i)
            { mod2sparse_insert(U,rinv[k],cols[i]);
            }
            else
            { mod2sparse_insert(L,k,i);
                mod2sparse_insert(U,i,cols[i]);
            }

            f = fn;
        }


        /* Get rid of all entries in the current column of B, just to save space. */

        for (;;)
        { f = mod2sparse_first_in_col(B,cols[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(B,f);
        }

        /* Abandon columns of B with lots of entries if it's time for that. */

        if (abandon_number>0 && i==abandon_when)
        {
            for (k = 0; k<M+1; k++)
            { acnt[k] = 0;
            }
            for (j = 0; j<N; j++)
            { k = mod2sparse_count_col(B,j);
                acnt[k] += 1;
            }

            cc = abandon_number;
            k = M;
            while (acnt[k]<cc)
            { cc -= acnt[k];
                k -= 1;
                if (k<0) abort();
            }

            cc2 = 0;
            for (j = 0; j<N; j++)
            { cc3 = mod2sparse_count_col(B,j);
                if (cc3>k || cc3==k && cc>0)
                { if (cc3==k) cc -= 1;
                    for (;;)
                    { f = mod2sparse_first_in_col(B,j);
                        if (mod2sparse_at_end(f)) break;
                        mod2sparse_delete(B,f);
                    }
                    cc2 += 1;
                }
            }

            if (cc2!=abandon_number) abort();

            if (strategy==Mod2sparse_minprod)
            { for (j = 0; j<M; j++)
                { rcnt[j] = mod2sparse_count_row(B,j);
                }
            }
        }
    }

    /* Get rid of all entries in the rows of L past row R, after reordering. */

    for (i = R; i<M; i++)
    { for (;;)
        { f = mod2sparse_first_in_row(L,rows[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(L,f);
        }
    }

    mod2sparse_free(B);
    free(rinv);
    free(cinv);
    if (strategy==Mod2sparse_minprod) free(rcnt);
    if (abandon_number>0) free(acnt);

    return nnf;
}